

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_compare.cpp
# Opt level: O0

bool __thiscall
ON_wString::EqualOrdinal(ON_wString *this,wchar_t *other_string,bool bOrdinalIgnoreCase)

{
  int element_count1;
  int iVar1;
  wchar_t *string1;
  undefined1 local_21;
  int length;
  bool bOrdinalIgnoreCase_local;
  wchar_t *other_string_local;
  ON_wString *this_local;
  
  element_count1 = Length(this);
  iVar1 = Length(other_string);
  local_21 = false;
  if (element_count1 == iVar1) {
    string1 = operator_cast_to_wchar_t_(this);
    local_21 = EqualOrdinal(string1,element_count1,other_string,element_count1,bOrdinalIgnoreCase);
  }
  return local_21;
}

Assistant:

bool ON_wString::EqualOrdinal(
  const wchar_t* other_string,
  bool bOrdinalIgnoreCase
  ) const
{
  const int length = Length();
  return (length == ON_wString::Length(other_string))
    && ON_wString::EqualOrdinal(
    static_cast< const wchar_t* >(*this),
    length,
    other_string,
    length,
    bOrdinalIgnoreCase
    );
}